

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O1

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::SetSideOrient
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,int side,int sideorient)

{
  if (side - 8U < 0xfffffffb) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHDivCollapsed.cpp"
               ,0x9e);
  }
  if (side < 6) {
    TPZCompElHDiv<pzshape::TPZShapeTriang>::SetSideOrient
              (&this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>,side,sideorient);
    return;
  }
  if (side == 6) {
    this->fbottom_side_orient = sideorient;
  }
  else {
    this->ftop_side_orient = sideorient;
  }
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::SetSideOrient(int side, int sideorient)
{
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    if (side < firstside || side >= TSHAPE::NSides + 1) {
        DebugStop();
    }

    if(side < TSHAPE::NSides-1) TPZCompElHDiv<TSHAPE>::SetSideOrient(side, sideorient);
    else if(side == TSHAPE::NSides-1 ) fbottom_side_orient = sideorient;
    else ftop_side_orient = sideorient;
}